

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O0

MyDB_PageHandle __thiscall MyDB_BufferManager::getPage(MyDB_BufferManager *this)

{
  size_t sVar1;
  bool bVar2;
  reference pvVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MyDB_BufferManager *in_RSI;
  MyDB_PageHandle MVar5;
  pair<std::shared_ptr<MyDB_Table>,_long> local_a0;
  undefined1 local_88 [8];
  pair<std::shared_ptr<MyDB_Table>,_long> curId_1;
  pair<std::shared_ptr<MyDB_Table>,_long> local_68;
  undefined1 local_50 [8];
  pair<std::shared_ptr<MyDB_Table>,_long> curId;
  MyDB_PageBase *local_28;
  MyDB_PageBase *newPage;
  MyDB_BufferManager *this_local;
  MyDB_PageHandle *phd;
  
  std::make_shared<MyDB_PageHandleBase>();
  bVar2 = std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
          empty(&in_RSI->slotQueue);
  if (bVar2) {
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair<std::shared_ptr<MyDB_Table>_&,_long_&,_true>
              ((pair<std::shared_ptr<MyDB_Table>,_long> *)local_88,&in_RSI->tempTable,
               &in_RSI->curpos);
    local_28 = (MyDB_PageBase *)operator_new(0x38);
    sVar1 = in_RSI->curpos;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair
              (&local_a0,(pair<std::shared_ptr<MyDB_Table>,_long> *)local_88);
    MyDB_PageBase::MyDB_PageBase(local_28,(void *)0x0,false,sVar1,false,0,&local_a0,in_RSI);
    std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair(&local_a0);
    in_RSI->curpos = in_RSI->curpos + 1;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair
              ((pair<std::shared_ptr<MyDB_Table>,_long> *)local_88);
  }
  else {
    pvVar3 = std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
             front(&in_RSI->slotQueue);
    std::pair<std::shared_ptr<MyDB_Table>,_long>::
    pair<std::shared_ptr<MyDB_Table>_&,_unsigned_long_&,_true>
              ((pair<std::shared_ptr<MyDB_Table>,_long> *)local_50,&in_RSI->tempTable,pvVar3);
    local_28 = (MyDB_PageBase *)operator_new(0x38);
    curId_1.second._7_1_ = 1;
    pvVar3 = std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
             front(&in_RSI->slotQueue);
    sVar1 = *pvVar3;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair
              (&local_68,(pair<std::shared_ptr<MyDB_Table>,_long> *)local_50);
    MyDB_PageBase::MyDB_PageBase(local_28,(void *)0x0,false,sVar1,false,0,&local_68,in_RSI);
    curId_1.second._7_1_ = 0;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair(&local_68);
    std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
              (&in_RSI->slotQueue);
    std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair
              ((pair<std::shared_ptr<MyDB_Table>,_long> *)local_50);
  }
  peVar4 = std::__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4->pagePtr = local_28;
  peVar4 = std::__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4->pagePtr->handleCount = peVar4->pagePtr->handleCount + 1;
  peVar4 = std::__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4->bufferManager = in_RSI;
  MVar5.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar5.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar5.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPage () {

	// the handle we will return
	MyDB_PageHandle phd = make_shared<MyDB_PageHandleBase>();

	//New one page
	//If the slotQueue is not empty, then get slotId from the slotQueue
	MyDB_PageBase* newPage;
	if (!slotQueue.empty()) {
		// id for the anonymous page, offset equals to slot
		pair<MyDB_TablePtr, long> curId(tempTable, slotQueue.front());
		newPage = new MyDB_PageBase (nullptr, false, slotQueue.front(), false, 0, curId, this);
		slotQueue.pop();
	}
	//If the slotQueue is empty, means there is no slotId can be recycled, then use the curpos
	else{
		// id for the anonymous page, offset equals to slot
		pair<MyDB_TablePtr, long> curId(tempTable, curpos);
		newPage = new MyDB_PageBase (nullptr, false, curpos, false, 0, curId, this);
		curpos ++;
	}
	// Don't need to update the anonymous page into the pageMap
	phd -> pagePtr = newPage;

	phd -> pagePtr -> handleCount ++;
	phd->bufferManager = this;

	return phd;
}